

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cpp
# Opt level: O0

CSipHasher * __thiscall CSipHasher::Write(CSipHasher *this,uint64_t data)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  _If_is_unsigned_integer<unsigned_long> _Var6;
  _If_is_unsigned_integer<unsigned_long> _Var7;
  ulong uVar8;
  _If_is_unsigned_integer<unsigned_long> _Var9;
  ulong uVar10;
  _If_is_unsigned_integer<unsigned_long> _Var11;
  _If_is_unsigned_integer<unsigned_long> _Var12;
  _If_is_unsigned_integer<unsigned_long> _Var13;
  ulong uVar14;
  ulong uVar15;
  ulong in_RSI;
  CSipHasher *in_RDI;
  long in_FS_OFFSET;
  uint64_t v3;
  uint64_t v2;
  uint64_t v1;
  uint64_t v0;
  int __s;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = in_RDI->v[0];
  uVar3 = in_RDI->v[1];
  uVar4 = in_RDI->v[2];
  if ((uint)in_RDI->count % 8 != 0) {
    __assert_fail("count % 8 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/siphash.cpp"
                  ,0x20,"CSipHasher &CSipHasher::Write(uint64_t)");
  }
  uVar5 = in_RSI ^ in_RDI->v[3];
  __s = (int)((ulong)in_RDI >> 0x20);
  _Var6 = std::rotl<unsigned_long>(uVar5,__s);
  _Var7 = std::rotl<unsigned_long>(uVar5,__s);
  uVar8 = uVar5 + uVar4;
  _Var9 = std::rotl<unsigned_long>(uVar5,__s);
  uVar5 = uVar8 ^ _Var9;
  uVar10 = uVar5 + _Var7;
  _Var7 = std::rotl<unsigned_long>(uVar5,__s);
  uVar5 = uVar10 ^ _Var7;
  _Var7 = std::rotl<unsigned_long>(uVar5,__s);
  _Var9 = std::rotl<unsigned_long>(uVar5,__s);
  _Var11 = std::rotl<unsigned_long>(uVar5,__s);
  _Var12 = std::rotl<unsigned_long>(uVar5,__s);
  _Var13 = std::rotl<unsigned_long>(uVar5,__s);
  uVar14 = uVar5 + _Var9 ^ _Var13;
  uVar15 = uVar14 + _Var12;
  _Var12 = std::rotl<unsigned_long>(uVar14,__s);
  uVar14 = uVar15 ^ _Var12;
  _Var12 = std::rotl<unsigned_long>(uVar14,__s);
  _Var13 = std::rotl<unsigned_long>(uVar14,__s);
  in_RDI->v[0] = uVar15 ^ in_RSI;
  in_RDI->v[1] = (((uVar3 + uVar2 ^ _Var6) + uVar8 ^ _Var7) + uVar10 ^ _Var11) + uVar5 + _Var9 ^
                 _Var12;
  in_RDI->v[2] = _Var13;
  in_RDI->v[3] = uVar14;
  in_RDI->count = in_RDI->count + '\b';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CSipHasher& CSipHasher::Write(uint64_t data)
{
    uint64_t v0 = v[0], v1 = v[1], v2 = v[2], v3 = v[3];

    assert(count % 8 == 0);

    v3 ^= data;
    SIPROUND;
    SIPROUND;
    v0 ^= data;

    v[0] = v0;
    v[1] = v1;
    v[2] = v2;
    v[3] = v3;

    count += 8;
    return *this;
}